

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStg.c
# Opt level: O2

void Gia_ManPrintStateEncoding(Vec_Vec_t *vCodes,int nBits)

{
  int iVar1;
  char *__s;
  Vec_Int_t *p;
  uint i;
  int i_00;
  
  __s = (char *)malloc((long)(nBits + 1));
  __s[nBits] = '\0';
  i = 0;
  do {
    if (vCodes->nSize <= (int)i) {
      free(__s);
      return;
    }
    p = Vec_VecEntryInt(vCodes,i);
    i = i + 1;
    printf("%6d : ",(ulong)i);
    memset(__s,0x2d,(long)nBits);
    for (i_00 = 0; i_00 < p->nSize; i_00 = i_00 + 1) {
      iVar1 = Vec_IntEntry(p,i_00);
      if (nBits <= iVar1) {
        __assert_fail("Bit < nBits",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaStg.c"
                      ,0x3b,"void Gia_ManPrintStateEncoding(Vec_Vec_t *, int)");
      }
      __s[iVar1] = '1';
    }
    puts(__s);
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Gia_ManPrintStateEncoding( Vec_Vec_t * vCodes, int nBits )
{
    char * pBuffer;
    Vec_Int_t * vVec;
    int i, k, Bit;
    pBuffer = ABC_ALLOC( char, nBits + 1 );
    pBuffer[nBits] = 0;
    Vec_VecForEachLevelInt( vCodes, vVec, i )
    {
        printf( "%6d : ", i+1 );
        memset( pBuffer, '-', (size_t)nBits );
        Vec_IntForEachEntry( vVec, Bit, k )
        {
            assert( Bit < nBits );
            pBuffer[Bit] = '1';
        }
        printf( "%s\n", pBuffer );
    }
    ABC_FREE( pBuffer );
}